

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Preprocessor.cpp
# Opt level: O3

ConditionalDirectiveExpressionSyntax * __thiscall
slang::parsing::Preprocessor::parseConditionalExpr(Preprocessor *this)

{
  Token *pTVar1;
  undefined2 uVar2;
  undefined2 uVar3;
  undefined2 uVar4;
  undefined1 uVar6;
  undefined1 uVar7;
  undefined1 uVar8;
  undefined1 uVar9;
  undefined1 uVar10;
  undefined1 uVar11;
  Info *pIVar5;
  undefined4 uVar12;
  undefined4 uVar13;
  undefined4 uVar14;
  undefined1 uVar15;
  NumericTokenFlags NVar16;
  uint32_t uVar17;
  uint uVar18;
  ConditionalDirectiveExpressionSyntax *pCVar19;
  ParenthesizedConditionalDirectiveExpressionSyntax *pPVar20;
  Token TVar21;
  Token TVar22;
  Token TVar23;
  Token openParen;
  Token op;
  Token closeParen;
  Token local_70;
  Token *local_60;
  Token *local_58;
  Token local_50;
  Token local_40;
  
  pTVar1 = &this->currentToken;
  pIVar5 = (this->currentToken).info;
  if (pIVar5 == (Info *)0x0) {
    TVar21 = nextProcessed(this);
    this->currentToken = TVar21;
  }
  else {
    uVar2 = pTVar1->kind;
    uVar6 = pTVar1->field_0x2;
    uVar9 = pTVar1->numFlags;
    uVar12 = pTVar1->rawLen;
    TVar21.rawLen = uVar12;
    TVar21.numFlags.raw = uVar9;
    TVar21._2_1_ = uVar6;
    TVar21.kind = uVar2;
    TVar21.info = pIVar5;
  }
  local_60 = pTVar1;
  if (TVar21.kind == Exclamation) {
    if (TVar21.info == (Info *)0x0) {
      TVar21 = nextProcessed(this);
      this->currentToken = TVar21;
    }
    uVar15 = pTVar1->field_0x2;
    NVar16.raw = (pTVar1->numFlags).raw;
    uVar17 = pTVar1->rawLen;
    pIVar5 = (this->currentToken).info;
    (this->lastConsumed).kind = pTVar1->kind;
    (this->lastConsumed).field_0x2 = uVar15;
    (this->lastConsumed).numFlags = (NumericTokenFlags)NVar16.raw;
    (this->lastConsumed).rawLen = uVar17;
    (this->lastConsumed).info = pIVar5;
    Token::Token(&local_70);
    TVar22 = local_70;
    pTVar1->kind = local_70.kind;
    pTVar1->field_0x2 = local_70._2_1_;
    pTVar1->numFlags = (NumericTokenFlags)local_70.numFlags.raw;
    pTVar1->rawLen = local_70.rawLen;
    (this->currentToken).info = local_70.info;
    pIVar5 = (this->currentToken).info;
    local_70 = TVar22;
    local_50 = TVar21;
    if (pIVar5 == (Info *)0x0) {
      TVar22 = nextProcessed(this);
      this->currentToken = TVar22;
    }
    else {
      uVar3 = pTVar1->kind;
      uVar7 = pTVar1->field_0x2;
      uVar10 = pTVar1->numFlags;
      uVar13 = pTVar1->rawLen;
      TVar22.rawLen = uVar13;
      TVar22.numFlags.raw = uVar10;
      TVar22._2_1_ = uVar7;
      TVar22.kind = uVar3;
      TVar22.info = pIVar5;
    }
    if (TVar22.kind == OpenParenthesis) {
      if (TVar22.info == (Info *)0x0) {
        TVar22 = nextProcessed(this);
        this->currentToken = TVar22;
      }
      uVar15 = pTVar1->field_0x2;
      NVar16.raw = (pTVar1->numFlags).raw;
      uVar17 = pTVar1->rawLen;
      pIVar5 = (this->currentToken).info;
      (this->lastConsumed).kind = pTVar1->kind;
      (this->lastConsumed).field_0x2 = uVar15;
      (this->lastConsumed).numFlags = (NumericTokenFlags)NVar16.raw;
      (this->lastConsumed).rawLen = uVar17;
      (this->lastConsumed).info = pIVar5;
      Token::Token(&local_70);
      pTVar1->kind = local_70.kind;
      pTVar1->field_0x2 = local_70._2_1_;
      pTVar1->numFlags = (NumericTokenFlags)local_70.numFlags.raw;
      pTVar1->rawLen = local_70.rawLen;
      (this->currentToken).info = local_70.info;
      local_70 = TVar22;
      pCVar19 = parseConditionalExpr(this);
      local_40 = expect(this,CloseParenthesis);
      pPVar20 = BumpAllocator::
                emplace<slang::syntax::ParenthesizedConditionalDirectiveExpressionSyntax,slang::parsing::Token&,slang::syntax::ConditionalDirectiveExpressionSyntax&,slang::parsing::Token&>
                          (this->alloc,&local_70,pCVar19,&local_40);
    }
    else {
      local_70 = expect(this,Identifier);
      pPVar20 = (ParenthesizedConditionalDirectiveExpressionSyntax *)
                BumpAllocator::
                emplace<slang::syntax::NamedConditionalDirectiveExpressionSyntax,slang::parsing::Token&>
                          (this->alloc,&local_70);
    }
    pPVar20 = (ParenthesizedConditionalDirectiveExpressionSyntax *)
              BumpAllocator::
              emplace<slang::syntax::UnaryConditionalDirectiveExpressionSyntax,slang::parsing::Token&,slang::syntax::ConditionalDirectiveExpressionSyntax&>
                        (this->alloc,&local_50,&pPVar20->super_ConditionalDirectiveExpressionSyntax)
    ;
  }
  else {
    if (TVar21.info == (Info *)0x0) {
      TVar21 = nextProcessed(this);
      this->currentToken = TVar21;
    }
    if (TVar21.kind == OpenParenthesis) {
      if (TVar21.info == (Info *)0x0) {
        TVar21 = nextProcessed(this);
        this->currentToken = TVar21;
      }
      uVar15 = pTVar1->field_0x2;
      NVar16.raw = (pTVar1->numFlags).raw;
      uVar17 = pTVar1->rawLen;
      pIVar5 = (this->currentToken).info;
      (this->lastConsumed).kind = pTVar1->kind;
      (this->lastConsumed).field_0x2 = uVar15;
      (this->lastConsumed).numFlags = (NumericTokenFlags)NVar16.raw;
      (this->lastConsumed).rawLen = uVar17;
      (this->lastConsumed).info = pIVar5;
      Token::Token(&local_70);
      pTVar1->kind = local_70.kind;
      pTVar1->field_0x2 = local_70._2_1_;
      pTVar1->numFlags = (NumericTokenFlags)local_70.numFlags.raw;
      pTVar1->rawLen = local_70.rawLen;
      (this->currentToken).info = local_70.info;
      local_70 = TVar21;
      pCVar19 = parseConditionalExpr(this);
      local_40 = expect(this,CloseParenthesis);
      pPVar20 = BumpAllocator::
                emplace<slang::syntax::ParenthesizedConditionalDirectiveExpressionSyntax,slang::parsing::Token&,slang::syntax::ConditionalDirectiveExpressionSyntax&,slang::parsing::Token&>
                          (this->alloc,&local_70,pCVar19,&local_40);
    }
    else {
      local_70 = expect(this,Identifier);
      pPVar20 = (ParenthesizedConditionalDirectiveExpressionSyntax *)
                BumpAllocator::
                emplace<slang::syntax::NamedConditionalDirectiveExpressionSyntax,slang::parsing::Token&>
                          (this->alloc,&local_70);
    }
  }
  pTVar1 = local_60;
  local_58 = &this->lastConsumed;
  while( true ) {
    pIVar5 = (this->currentToken).info;
    if (pIVar5 == (Info *)0x0) {
      TVar23 = nextProcessed(this);
      this->currentToken = TVar23;
    }
    else {
      uVar4 = local_60->kind;
      uVar8 = local_60->field_0x2;
      uVar11 = local_60->numFlags;
      uVar14 = local_60->rawLen;
      TVar23.rawLen = uVar14;
      TVar23.numFlags.raw = uVar11;
      TVar23._2_1_ = uVar8;
      TVar23.kind = uVar4;
      TVar23.info = pIVar5;
    }
    uVar18 = (TVar23._0_4_ & 0xffff) - 0x26;
    if ((0x34 < uVar18) || ((0x10440000000001U >> ((ulong)uVar18 & 0x3f) & 1) == 0)) break;
    if (TVar23.info == (Info *)0x0) {
      TVar23 = nextProcessed(this);
      this->currentToken = TVar23;
    }
    uVar15 = pTVar1->field_0x2;
    NVar16.raw = (pTVar1->numFlags).raw;
    uVar17 = pTVar1->rawLen;
    pIVar5 = pTVar1->info;
    local_58->kind = pTVar1->kind;
    local_58->field_0x2 = uVar15;
    local_58->numFlags = (NumericTokenFlags)NVar16.raw;
    local_58->rawLen = uVar17;
    local_58->info = pIVar5;
    Token::Token(&local_70);
    pTVar1->kind = local_70.kind;
    pTVar1->field_0x2 = local_70._2_1_;
    pTVar1->numFlags = (NumericTokenFlags)local_70.numFlags.raw;
    pTVar1->rawLen = local_70.rawLen;
    pTVar1->info = local_70.info;
    local_70 = TVar23;
    pCVar19 = parseConditionalExpr(this);
    pPVar20 = (ParenthesizedConditionalDirectiveExpressionSyntax *)
              BumpAllocator::
              emplace<slang::syntax::BinaryConditionalDirectiveExpressionSyntax,slang::syntax::ConditionalDirectiveExpressionSyntax&,slang::parsing::Token&,slang::syntax::ConditionalDirectiveExpressionSyntax&>
                        (this->alloc,&pPVar20->super_ConditionalDirectiveExpressionSyntax,&local_70,
                         pCVar19);
  }
  return &pPVar20->super_ConditionalDirectiveExpressionSyntax;
}

Assistant:

ConditionalDirectiveExpressionSyntax* Preprocessor::parseConditionalExpr() {
    auto isBinaryOp = [](TokenKind kind) {
        switch (kind) {
            case TokenKind::DoubleAnd:
            case TokenKind::DoubleOr:
            case TokenKind::MinusArrow:
            case TokenKind::LessThanMinusArrow:
                return true;
            default:
                return false;
        }
    };

    auto parsePrimary = [&]() -> ConditionalDirectiveExpressionSyntax* {
        Token token = peek();
        if (token.kind == TokenKind::OpenParenthesis) {
            auto openParen = consume();
            auto operand = parseConditionalExpr();
            auto closeParen = expect(TokenKind::CloseParenthesis);
            return alloc.emplace<ParenthesizedConditionalDirectiveExpressionSyntax>(openParen,
                                                                                    *operand,
                                                                                    closeParen);
        }
        else {
            auto id = expect(TokenKind::Identifier);
            return alloc.emplace<NamedConditionalDirectiveExpressionSyntax>(id);
        }
    };

    ConditionalDirectiveExpressionSyntax* left;
    if (peek(TokenKind::Exclamation)) {
        auto op = consume();
        auto operand = parsePrimary();
        left = alloc.emplace<UnaryConditionalDirectiveExpressionSyntax>(op, *operand);
    }
    else {
        left = parsePrimary();
    }

    while (true) {
        if (!isBinaryOp(peek().kind))
            break;

        auto op = consume();
        auto right = parseConditionalExpr();
        left = alloc.emplace<BinaryConditionalDirectiveExpressionSyntax>(*left, op, *right);
    }

    return left;
}